

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_0::CWriter::WritePrefixBinaryExpr(CWriter *this,Opcode opcode,char *op)

{
  Type type;
  size_t size;
  StackVar *in_RCX;
  char (*in_R8) [3];
  Newline *in_R9;
  Opcode opcode_local;
  char local_40 [8];
  StackVar local_38;
  StackVar local_30;
  
  opcode_local = opcode;
  type = Opcode::GetResultType(&opcode_local);
  local_30.index = 1;
  local_38.index = 1;
  local_38.type.enum_ = Any;
  local_40[0] = '\0';
  local_40[1] = '\0';
  local_40[2] = '\0';
  local_40[3] = '\0';
  local_40[4] = '\0';
  local_40[5] = '\0';
  local_40[6] = '\0';
  local_40[7] = '\0';
  local_30.type = type;
  Write(this,&local_30);
  WriteData(this," = ",3);
  size = strlen(op);
  WriteData(this,op,size);
  WriteData(this,"(",1);
  (anonymous_namespace)::CWriter::
  Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,&local_38,(char (*) [3])local_40,in_RCX,in_R8,in_R9);
  DropTypes(this,2);
  PushType(this,type);
  return;
}

Assistant:

void CWriter::WritePrefixBinaryExpr(Opcode opcode, const char* op) {
  Type result_type = opcode.GetResultType();
  Write(StackVar(1, result_type), " = ", op, "(", StackVar(1), ", ",
        StackVar(0), ");", Newline());
  DropTypes(2);
  PushType(result_type);
}